

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::reDim(SPxSolverBase<double> *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<double> *in_RDI;
  int newsize;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  UnitVectorBase<double> *in_stack_ffffffffffffff40;
  UpdateVector<double> *this_00;
  undefined8 in_stack_ffffffffffffff48;
  UnitVectorBase<double> *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff68;
  VectorBase<double> *pVVar4;
  VectorBase<double> *in_stack_ffffffffffffff70;
  VectorBase<double> *this_01;
  int local_4c;
  UnitVectorBase<double> local_30;
  int local_c;
  
  iVar2 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x21d154);
  iVar3 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x21d168);
  if (iVar3 < iVar2) {
    local_4c = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x21d182);
  }
  else {
    local_4c = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x21d195);
  }
  local_c = local_4c;
  iVar2 = Array<soplex::UnitVectorBase<double>_>::size
                    ((Array<soplex::UnitVectorBase<double>_> *)0x21d1c3);
  if (iVar2 < local_4c) {
    Array<soplex::UnitVectorBase<double>_>::reSize
              ((Array<soplex::UnitVectorBase<double>_> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff3c);
    while (iVar2 = local_c + -1, bVar1 = 0 < local_c, local_c = iVar2, bVar1) {
      UnitVectorBase<double>::UnitVectorBase
                (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      Array<soplex::UnitVectorBase<double>_>::operator[]
                ((Array<soplex::UnitVectorBase<double>_> *)in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff3c);
      UnitVectorBase<double>::operator=
                (in_stack_ffffffffffffff40,
                 (UnitVectorBase<double> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      UnitVectorBase<double>::~UnitVectorBase(&local_30);
    }
  }
  bVar1 = isInitialized(in_RDI);
  if (bVar1) {
    this_00 = (UpdateVector<double> *)in_RDI->theFrhs;
    dim((SPxSolverBase<double> *)0x21d2ad);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff68 >> 0x18,0));
    dim((SPxSolverBase<double> *)0x21d2d7);
    UpdateVector<double>::reDim(this_00,in_stack_ffffffffffffff3c);
    coDim((SPxSolverBase<double> *)0x21d2fc);
    UpdateVector<double>::reDim(this_00,in_stack_ffffffffffffff3c);
    dim((SPxSolverBase<double> *)0x21d321);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff68 >> 0x18,0));
    dim((SPxSolverBase<double> *)0x21d34b);
    UpdateVector<double>::reDim(this_00,in_stack_ffffffffffffff3c);
    pVVar4 = &in_RDI->theTest;
    coDim((SPxSolverBase<double> *)0x21d372);
    VectorBase<double>::reDim
              (in_stack_ffffffffffffff70,(int)((ulong)pVVar4 >> 0x20),SUB81((ulong)pVVar4 >> 0x18,0)
              );
    this_01 = &in_RDI->theCoTest;
    dim((SPxSolverBase<double> *)0x21d39e);
    VectorBase<double>::reDim(this_01,(int)((ulong)pVVar4 >> 0x20),SUB81((ulong)pVVar4 >> 0x18,0));
    SPxLPBase<double>::nRows((SPxLPBase<double> *)0x21d3ca);
    VectorBase<double>::reDim(this_01,(int)((ulong)pVVar4 >> 0x20),SUB81((ulong)pVVar4 >> 0x18,0));
    SPxLPBase<double>::nRows((SPxLPBase<double> *)0x21d3f6);
    VectorBase<double>::reDim(this_01,(int)((ulong)pVVar4 >> 0x20),SUB81((ulong)pVVar4 >> 0x18,0));
    SPxLPBase<double>::nCols((SPxLPBase<double> *)0x21d422);
    VectorBase<double>::reDim(this_01,(int)((ulong)pVVar4 >> 0x20),SUB81((ulong)pVVar4 >> 0x18,0));
    SPxLPBase<double>::nCols((SPxLPBase<double> *)0x21d44e);
    VectorBase<double>::reDim(this_01,(int)((ulong)pVVar4 >> 0x20),SUB81((ulong)pVVar4 >> 0x18,0));
    dim((SPxSolverBase<double> *)0x21d47a);
    VectorBase<double>::reDim(this_01,(int)((ulong)pVVar4 >> 0x20),SUB81((ulong)pVVar4 >> 0x18,0));
    dim((SPxSolverBase<double> *)0x21d4a6);
    VectorBase<double>::reDim(this_01,(int)((ulong)pVVar4 >> 0x20),SUB81((ulong)pVVar4 >> 0x18,0));
  }
  return;
}

Assistant:

void SPxSolverBase<R>::reDim()
   {

      int newsize = SPxLPBase<R>::nCols() > SPxLPBase<R>::nRows() ? SPxLPBase<R>::nCols() :
                    SPxLPBase<R>::nRows();

      if(newsize > unitVecs.size())
      {
         unitVecs.reSize(newsize);

         while(newsize-- > 0)
            unitVecs[newsize] = UnitVectorBase<R>(newsize);
      }

      if(isInitialized())
      {
         theFrhs->reDim(dim());
         theFvec->reDim(dim());
         thePvec->reDim(coDim());

         theCoPrhs->reDim(dim());
         theCoPvec->reDim(dim());

         theTest.reDim(coDim());
         theCoTest.reDim(dim());

         theURbound.reDim(SPxLPBase<R>::nRows());
         theLRbound.reDim(SPxLPBase<R>::nRows());
         theUCbound.reDim(SPxLPBase<R>::nCols());
         theLCbound.reDim(SPxLPBase<R>::nCols());
         theUBbound.reDim(dim());
         theLBbound.reDim(dim());
      }
   }